

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolui.c
# Opt level: O1

int ffgsfui(fitsfile *fptr,int colnum,int naxis,long *naxes,long *blc,long *trc,long *inc,
           unsigned_short *array,char *flagval,int *anynul,int *status)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  long firstelem;
  long lVar4;
  unsigned_short *array_00;
  long lVar5;
  bool bVar6;
  int local_374;
  long local_370;
  long local_350;
  long local_348;
  long local_340;
  long local_338;
  long local_330;
  long local_320;
  int hdutype;
  long local_310;
  long local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  long local_288;
  long local_280;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  long local_248;
  long local_240;
  long local_238;
  long local_230;
  long local_228;
  long local_220;
  long local_218;
  long local_210;
  long local_208;
  long local_200;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  long local_1d0;
  long str [9];
  long dsize [10];
  long incr [9];
  long stp [9];
  LONGLONG blcll [9];
  
  if (naxis - 10U < 0xfffffff7) {
    snprintf((char *)blcll,0x51,"NAXIS = %d in call to ffgsvi is out of range",(ulong)(uint)naxis);
    ffpmsg((char *)blcll);
    *status = 0x140;
    return 0x140;
  }
  iVar1 = fits_is_compressed_image(fptr,status);
  if (iVar1 != 0) {
    if (naxis != 0) {
      memcpy(blcll,blc,(ulong)(uint)naxis << 3);
      memcpy(dsize,trc,(ulong)(uint)naxis << 3);
    }
    fits_read_compressed_img(fptr,0x14,blcll,dsize,inc,2,(void *)0x0,array,flagval,anynul,status);
LAB_001a66e5:
    return *status;
  }
  iVar1 = ffghdt(fptr,&hdutype,status);
  if (0 < iVar1) goto LAB_001a66e5;
  if (hdutype == 0) {
    local_240 = (long)(int)(colnum + (uint)(colnum == 0));
    local_374 = 2;
    local_310 = 1;
    local_370 = local_240;
  }
  else {
    local_240 = trc[(uint)naxis];
    local_310 = inc[(uint)naxis];
    local_374 = colnum;
    local_370 = blc[(uint)naxis];
  }
  if (anynul != (int *)0x0) {
    *anynul = 0;
  }
  lVar2 = 0;
  do {
    str[lVar2] = 1;
    stp[lVar2] = 1;
    incr[lVar2] = 1;
    dsize[lVar2] = 1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 9);
  if (naxis != 0) {
    uVar3 = 1;
    do {
      lVar2 = trc[uVar3 - 1];
      if (lVar2 < blc[uVar3 - 1]) {
        snprintf((char *)blcll,0x51,"ffgsvi: illegal range specified for axis %ld");
        ffpmsg((char *)blcll);
        *status = 0x141;
        return 0x141;
      }
      str[uVar3 - 1] = blc[uVar3 - 1];
      stp[uVar3 - 1] = lVar2;
      dsize[uVar3 + 9] = inc[uVar3 - 1];
      dsize[uVar3] = naxes[uVar3 - 1] * dsize[uVar3 - 1];
      bVar6 = uVar3 != (uint)naxis;
      uVar3 = uVar3 + 1;
    } while (bVar6);
    if ((naxis == 1) && (*naxes == 1)) {
      lVar2 = (local_240 - local_370) / local_310;
      local_240 = local_370;
      local_2b0 = local_310;
      goto LAB_001a6856;
    }
  }
  lVar2 = (stp[0] - str[0]) / *inc;
  local_2b0 = incr[0];
LAB_001a6856:
  if (local_370 <= local_240) {
    local_2c0 = str[8];
    local_1f8 = str[1];
    local_2a8 = (str[1] + -1) * dsize[1] + (str[2] + -1) * dsize[2] + (str[3] + -1) * dsize[3] +
                (str[4] + -1) * dsize[4] +
                (str[5] + -1) * dsize[5] + (str[6] + -1) * dsize[6] + (str[7] + -1) * dsize[7] +
                (str[8] + -1) * dsize[8] + str[0];
    local_1d8 = lVar2 * 2 + 2;
    local_2a0 = incr[8];
    local_298 = dsize[8] * incr[8];
    local_290 = incr[7];
    local_288 = dsize[7] * incr[7];
    local_280 = incr[6];
    local_278 = dsize[6] * incr[6];
    local_270 = incr[5];
    local_268 = incr[4];
    local_248 = incr[3];
    local_238 = incr[2];
    local_230 = dsize[2] * incr[2];
    local_1e0 = incr[1];
    local_1d0 = dsize[1] * incr[1];
    local_2d8 = stp[6];
    local_2d0 = stp[4];
    local_2c8 = stp[3];
    local_2b8 = stp[2];
    lVar5 = 0;
    local_200 = str[7];
    local_208 = str[6];
    local_210 = str[5];
    local_218 = str[4];
    local_220 = str[3];
    local_228 = str[2];
    local_250 = stp[8];
    local_258 = stp[7];
    local_260 = stp[5];
    do {
      if (str[8] <= stp[8]) {
        local_350 = local_2a8;
        local_308 = str[8];
        do {
          if (str[7] <= stp[7]) {
            local_348 = local_350;
            local_300 = str[7];
            do {
              if (str[6] <= local_2d8) {
                local_340 = local_348;
                local_2f8 = str[6];
                do {
                  if (str[5] <= stp[5]) {
                    local_338 = local_340;
                    local_2f0 = str[5];
                    do {
                      if (str[4] <= local_2d0) {
                        local_330 = local_338;
                        local_2e8 = str[4];
                        do {
                          if (str[3] <= local_2c8) {
                            local_320 = local_330;
                            local_1f0 = str[2];
                            local_2e0 = str[3];
                            do {
                              str[2] = local_1f0;
                              firstelem = local_320;
                              if (local_1f0 <= local_2b8) {
                                do {
                                  local_1e8 = firstelem;
                                  if (local_1f8 <= stp[1]) {
                                    array_00 = array + lVar5;
                                    lVar4 = local_1f8;
                                    do {
                                      iVar1 = ffgclui(fptr,local_374,local_370,firstelem,lVar2 + 1,
                                                      local_2b0,2,0,array_00,flagval + lVar5,
                                                      (int *)blcll,status);
                                      if (0 < iVar1) goto LAB_001a6865;
                                      if ((anynul != (int *)0x0) && ((int)blcll[0] != 0)) {
                                        *anynul = 1;
                                      }
                                      lVar5 = lVar5 + lVar2 + 1;
                                      lVar4 = lVar4 + local_1e0;
                                      array_00 = (unsigned_short *)((long)array_00 + local_1d8);
                                      firstelem = firstelem + local_1d0;
                                    } while (lVar4 <= stp[1]);
                                  }
                                  local_1f0 = local_1f0 + local_238;
                                  str[2] = local_228;
                                  str[8] = local_2c0;
                                  str[3] = local_220;
                                  firstelem = local_1e8 + local_230;
                                  str[7] = local_200;
                                  str[6] = local_208;
                                  str[5] = local_210;
                                  str[4] = local_218;
                                } while (local_1f0 <= local_2b8);
                              }
                              local_2e0 = local_2e0 + local_248;
                              local_320 = local_320 + dsize[3] * incr[3];
                              local_1f0 = str[2];
                              stp[5] = local_260;
                              stp[7] = local_258;
                              stp[8] = local_250;
                            } while (local_2e0 <= local_2c8);
                          }
                          local_2e8 = local_2e8 + local_268;
                          local_330 = local_330 + dsize[4] * incr[4];
                        } while (local_2e8 <= local_2d0);
                      }
                      local_2f0 = local_2f0 + local_270;
                      local_338 = local_338 + dsize[5] * incr[5];
                    } while (local_2f0 <= stp[5]);
                  }
                  local_2f8 = local_2f8 + local_280;
                  local_340 = local_340 + local_278;
                } while (local_2f8 <= local_2d8);
              }
              local_300 = local_300 + local_290;
              local_348 = local_348 + local_288;
            } while (local_300 <= stp[7]);
          }
          local_308 = local_308 + local_2a0;
          local_350 = local_350 + local_298;
        } while (local_308 <= stp[8]);
      }
      local_370 = local_370 + local_310;
    } while (local_370 <= local_240);
  }
LAB_001a6865:
  return *status;
}

Assistant:

int ffgsfui(fitsfile *fptr, /* I - FITS file pointer                         */
           int  colnum,    /* I - number of the column to read (1 = 1st)    */
           int naxis,      /* I - number of dimensions in the FITS array    */
           long  *naxes,   /* I - size of each dimension                    */
           long  *blc,     /* I - 'bottom left corner' of the subsection    */
           long  *trc,     /* I - 'top right corner' of the subsection      */
           long  *inc,     /* I - increment to be applied in each dimension */
  unsigned short *array,   /* O - array to be filled and returned           */
           char *flagval,  /* O - set to 1 if corresponding value is null   */
           int  *anynul,   /* O - set to 1 if any values are null; else 0   */
           int  *status)   /* IO - error status                             */
/*
  Read a subsection of data values from an image or a table column.
  This routine is set up to handle a maximum of nine dimensions.
*/
{
    long ii,i0, i1,i2,i3,i4,i5,i6,i7,i8,row,rstr,rstp,rinc;
    long str[9],stp[9],incr[9],dsize[10];
    LONGLONG blcll[9], trcll[9];
    long felem, nelem, nultyp, ninc, numcol;
    int hdutype, anyf;
    unsigned short nulval = 0;
    char msg[FLEN_ERRMSG];
    int nullcheck = 2;

    if (naxis < 1 || naxis > 9)
    {
        snprintf(msg, FLEN_ERRMSG,"NAXIS = %d in call to ffgsvi is out of range", naxis);
        ffpmsg(msg);
        return(*status = BAD_DIMEN);
    }

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        for (ii=0; ii < naxis; ii++) {
	    blcll[ii] = blc[ii];
	    trcll[ii] = trc[ii];
	}

        fits_read_compressed_img(fptr, TUSHORT, blcll, trcll, inc,
            nullcheck, NULL, array, flagval, anynul, status);
        return(*status);
    }

/*
    if this is a primary array, then the input COLNUM parameter should
    be interpreted as the row number, and we will alway read the image
    data from column 2 (any group parameters are in column 1).
*/
    if (ffghdt(fptr, &hdutype, status) > 0)
        return(*status);

    if (hdutype == IMAGE_HDU)
    {
        /* this is a primary array, or image extension */
        if (colnum == 0)
        {
            rstr = 1;
            rstp = 1;
        }
        else
        {
            rstr = colnum;
            rstp = colnum;
        }
        rinc = 1;
        numcol = 2;
    }
    else
    {
        /* this is a table, so the row info is in the (naxis+1) elements */
        rstr = blc[naxis];
        rstp = trc[naxis];
        rinc = inc[naxis];
        numcol = colnum;
    }

    nultyp = 2;
    if (anynul)
        *anynul = FALSE;

    i0 = 0;
    for (ii = 0; ii < 9; ii++)
    {
        str[ii] = 1;
        stp[ii] = 1;
        incr[ii] = 1;
        dsize[ii] = 1;
    }

    for (ii = 0; ii < naxis; ii++)
    {
      if (trc[ii] < blc[ii])
      {
        snprintf(msg, FLEN_ERRMSG,"ffgsvi: illegal range specified for axis %ld", ii + 1);
        ffpmsg(msg);
        return(*status = BAD_PIX_NUM);
      }

      str[ii] = blc[ii];
      stp[ii] = trc[ii];
      incr[ii] = inc[ii];
      dsize[ii + 1] = dsize[ii] * naxes[ii];
    }

    if (naxis == 1 && naxes[0] == 1)
    {
      /* This is not a vector column, so read all the rows at once */
      nelem = (rstp - rstr) / rinc + 1;
      ninc = rinc;
      rstp = rstr;
    }
    else
    {
      /* have to read each row individually, in all dimensions */
      nelem = (stp[0] - str[0]) / inc[0] + 1;
      ninc = incr[0];
    }

    for (row = rstr; row <= rstp; row += rinc)
    {
     for (i8 = str[8]; i8 <= stp[8]; i8 += incr[8])
     {
      for (i7 = str[7]; i7 <= stp[7]; i7 += incr[7])
      {
       for (i6 = str[6]; i6 <= stp[6]; i6 += incr[6])
       {
        for (i5 = str[5]; i5 <= stp[5]; i5 += incr[5])
        {
         for (i4 = str[4]; i4 <= stp[4]; i4 += incr[4])
         {
          for (i3 = str[3]; i3 <= stp[3]; i3 += incr[3])
          {
           for (i2 = str[2]; i2 <= stp[2]; i2 += incr[2])
           {
            for (i1 = str[1]; i1 <= stp[1]; i1 += incr[1])
            {
              felem=str[0] + (i1 - 1) * dsize[1] + (i2 - 1) * dsize[2] + 
                             (i3 - 1) * dsize[3] + (i4 - 1) * dsize[4] +
                             (i5 - 1) * dsize[5] + (i6 - 1) * dsize[6] +
                             (i7 - 1) * dsize[7] + (i8 - 1) * dsize[8];

              if ( ffgclui(fptr, numcol, row, felem, nelem, ninc, nultyp,
                   nulval, &array[i0], &flagval[i0], &anyf, status) > 0)
                   return(*status);

              if (anyf && anynul)
                  *anynul = TRUE;

              i0 += nelem;
            }
           }
          }
         }
        }
       }
      }
     }
    }
    return(*status);
}